

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  WritableFile *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WritableFile::WritableFile(in_stack_ffffffffffffffa8);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__PosixWritableFile_016185f0;
  in_RDI[0x800]._M_string_length = 0;
  *(undefined4 *)&in_RDI[0x800].field_2 = in_EDX;
  bVar2 = IsManifest(in_RDI);
  in_RDI[0x800].field_2._M_local_buf[4] = bVar2;
  std::__cxx11::string::string
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  Dirname(in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}